

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O3

void __thiscall Nova::Simplex_Mesh<4>::Initialize_Incident_Elements(Simplex_Mesh<4> *this)

{
  vector<int,std::allocator<int>> *this_00;
  pointer pAVar1;
  iterator __position;
  Array<Nova::Array<int>_> *pAVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  pointer pVVar8;
  allocator_type local_49;
  value_type local_48;
  
  pAVar2 = this->incident_elements;
  if (pAVar2 != (Array<Nova::Array<int>_> *)0x0) {
    std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar2->_data);
    operator_delete(pAVar2);
  }
  pAVar2 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::vector
            ((vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_> *)pAVar2,
             this->number_of_nodes,&local_48,&local_49);
  this->incident_elements = pAVar2;
  if (local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pVVar8 = (this->elements)._data.
           super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->elements)._data.
                super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8;
  if (lVar3 != 0) {
    uVar4 = lVar3 >> 4;
    uVar7 = 0;
    do {
      iVar6 = (int)uVar7;
      if (uVar4 <= (ulong)(long)iVar6) {
LAB_0010cb1b:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      lVar3 = 0;
      do {
        uVar5 = (ulong)*(int *)((long)pVVar8[iVar6]._data._M_elems + lVar3 * 4);
        pAVar1 = (this->incident_elements->_data).
                 super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->incident_elements->_data).
                       super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 3) *
                -0x5555555555555555;
        if (uVar4 < uVar5 || uVar4 - uVar5 == 0) goto LAB_0010cb1b;
        this_00 = (vector<int,std::allocator<int>> *)(pAVar1 + uVar5);
        local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_48._data.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar6);
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,(int *)&local_48);
        }
        else {
          *__position._M_current = iVar6;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      uVar7 = uVar7 + 1;
      pVVar8 = (this->elements)._data.
               super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->elements)._data.
                    super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8 >> 4;
    } while (uVar7 < uVar4);
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Incident_Elements()
{
    if(incident_elements!=nullptr) delete incident_elements;
    incident_elements=new Array<Array<int>>(number_of_nodes);
    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) (*incident_elements)(element[i]).Append(t);}
}